

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall cmCTestTestHandler::SetTestOutputTruncation(cmCTestTestHandler *this,string *mode)

{
  bool bVar1;
  TruncationMode TVar2;
  
  bVar1 = std::operator==(mode,"tail");
  TVar2 = Tail;
  if (!bVar1) {
    bVar1 = std::operator==(mode,"middle");
    if (bVar1) {
      TVar2 = Middle;
    }
    else {
      bVar1 = std::operator==(mode,"head");
      if (!bVar1) {
        return false;
      }
      TVar2 = Head;
    }
  }
  this->TestOutputTruncation = TVar2;
  return true;
}

Assistant:

bool cmCTestTestHandler::SetTestOutputTruncation(const std::string& mode)
{
  if (mode == "tail") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Tail;
  } else if (mode == "middle") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Middle;
  } else if (mode == "head") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Head;
  } else {
    return false;
  }
  return true;
}